

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

cl_program __thiscall
CLIntercept::createProgramWithInjectionSPIRV
          (CLIntercept *this,uint64_t hash,cl_context context,cl_int *errcode_ret)

{
  mutex *__mutex;
  int iVar1;
  long *plVar2;
  undefined8 *puVar3;
  ulong uVar4;
  void *pvVar5;
  cl_program p_Var6;
  undefined8 uVar7;
  long *plVar8;
  pointer unaff_RBP;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 uVar9;
  float __x;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 uVar10;
  string fileName1;
  string fileName2;
  string fileName;
  ifstream is;
  char numberString1 [256];
  char numberString2 [256];
  long *local_4f0;
  long local_4e0;
  undefined4 uStack_4d8;
  undefined4 uStack_4d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  undefined1 local_490 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480;
  string local_470;
  cl_context local_450;
  cl_int *local_448;
  string local_440;
  int aiStack_420 [122];
  allocator local_238 [256];
  char local_138 [264];
  
  __mutex = &this->m_Mutex;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 != 0) {
    uVar7 = std::__throw_system_error(iVar1);
    if (local_4f0 != (long *)errcode_ret) {
      operator_delete(local_4f0);
    }
    if (local_4d0._M_dataplus._M_p != unaff_RBP) {
      operator_delete(local_4d0._M_dataplus._M_p);
    }
    std::ifstream::~ifstream(&local_440);
    if ((cl_context)local_490._0_8_ != context) {
      operator_delete((void *)local_490._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
      operator_delete(local_4b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != &local_470.field_2) {
      operator_delete(local_470._M_dataplus._M_p);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar7);
  }
  if ((this->m_Dispatch).clCreateProgramWithIL == (cl_api_clCreateProgramWithIL)0x0) {
    local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_440,
               "Aborting InjectProgramSPIRV because clCreateProgramWithIL is NULL!\n","");
    log(this,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != &local_440.field_2) {
      operator_delete(local_440._M_dataplus._M_p);
    }
    p_Var6 = (cl_program)0x0;
    goto LAB_001867fe;
  }
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  local_470._M_string_length = 0;
  local_470.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_440,sc_DumpDirectoryName,local_238);
  OS::Services_Common::GetDumpDirectoryNameWithoutPid
            (&(this->m_OS).super_Services_Common,&local_440,&local_470);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != &local_440.field_2) {
    operator_delete(local_440._M_dataplus._M_p);
  }
  std::__cxx11::string::append((char *)&local_470);
  local_450 = context;
  local_448 = errcode_ret;
  memset(local_238,0,0x100);
  snprintf((char *)local_238,0x100,"%04u_%08X_0000",(ulong)this->m_ProgramNumber,hash & 0xffffffff);
  memset(local_138,0,0x100);
  snprintf(local_138,0x100,"%08X_0000",hash & 0xffffffff);
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  local_4b0._M_string_length = 0;
  local_4b0.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&local_4b0);
  std::__cxx11::string::append((char *)&local_4b0);
  std::__cxx11::string::append((char *)&local_4b0);
  std::__cxx11::string::append((char *)&local_4b0);
  local_490._8_8_ = 0;
  local_480._M_local_buf[0] = '\0';
  local_490._0_8_ = (cl_context)(local_490 + 0x10);
  std::__cxx11::string::_M_assign((string *)local_490);
  std::__cxx11::string::append(local_490);
  std::__cxx11::string::append(local_490);
  std::__cxx11::string::append(local_490);
  std::ifstream::ifstream(&local_440);
  std::ifstream::open((char *)&local_440,(_Ios_Openmode)local_4b0._M_dataplus._M_p);
  if (*(int *)((long)aiStack_420 + *(long *)(local_440._M_dataplus._M_p + -0x18)) == 0) {
    std::operator+(&local_4d0,"Injecting SPIR-V file: ",&local_4b0);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_4d0);
    plVar8 = plVar2 + 2;
    if ((long *)*plVar2 == plVar8) {
      uVar9 = (undefined4)*plVar8;
      uVar10 = *(undefined4 *)((long)plVar2 + 0x14);
      local_4e0 = *plVar8;
      uStack_4d8 = (undefined4)plVar2[3];
      uStack_4d4 = *(undefined4 *)((long)plVar2 + 0x1c);
      local_4f0 = &local_4e0;
    }
    else {
      local_4e0 = *plVar8;
      uVar9 = extraout_XMM0_Da_01;
      uVar10 = extraout_XMM0_Db_01;
      local_4f0 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar8;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    log(this,(double)CONCAT44(uVar10,uVar9));
    if (local_4f0 != &local_4e0) {
      operator_delete(local_4f0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) goto LAB_001866f0;
  }
  else {
    std::operator+(&local_4d0,"Injection SPIR-V file doesn\'t exist: ",&local_4b0);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_4d0);
    plVar8 = plVar2 + 2;
    if ((long *)*plVar2 == plVar8) {
      uVar9 = (undefined4)*plVar8;
      uVar10 = *(undefined4 *)((long)plVar2 + 0x14);
      local_4e0 = *plVar8;
      uStack_4d8 = (undefined4)plVar2[3];
      uStack_4d4 = *(undefined4 *)((long)plVar2 + 0x1c);
      local_4f0 = &local_4e0;
    }
    else {
      local_4e0 = *plVar8;
      uVar9 = extraout_XMM0_Da;
      uVar10 = extraout_XMM0_Db;
      local_4f0 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar8;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    log(this,(double)CONCAT44(uVar10,uVar9));
    if (local_4f0 != &local_4e0) {
      operator_delete(local_4f0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
      operator_delete(local_4d0._M_dataplus._M_p);
    }
    std::ios::clear((int)&local_440 + (int)*(undefined8 *)(local_440._M_dataplus._M_p + -0x18));
    std::ifstream::open((char *)&local_440,(_Ios_Openmode)local_490._0_8_);
    if (*(int *)((long)aiStack_420 + *(long *)(local_440._M_dataplus._M_p + -0x18)) == 0) {
      std::operator+(&local_4d0,"Injecting SPIR-V file: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_490)
      ;
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_4d0);
      plVar2 = puVar3 + 2;
      if ((long *)*puVar3 == plVar2) {
        uVar9 = (undefined4)*plVar2;
        uVar10 = *(undefined4 *)((long)puVar3 + 0x14);
        local_4e0 = *plVar2;
        uStack_4d8 = *(undefined4 *)(puVar3 + 3);
        uStack_4d4 = *(undefined4 *)((long)puVar3 + 0x1c);
        local_4f0 = &local_4e0;
      }
      else {
        local_4e0 = *plVar2;
        uVar9 = extraout_XMM0_Da_03;
        uVar10 = extraout_XMM0_Db_03;
        local_4f0 = (long *)*puVar3;
      }
      *puVar3 = plVar2;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      log(this,(double)CONCAT44(uVar10,uVar9));
    }
    else {
      std::operator+(&local_4d0,"Injection SPIR-V file doesn\'t exist: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_490)
      ;
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_4d0);
      plVar2 = puVar3 + 2;
      if ((long *)*puVar3 == plVar2) {
        uVar9 = (undefined4)*plVar2;
        uVar10 = *(undefined4 *)((long)puVar3 + 0x14);
        local_4e0 = *plVar2;
        uStack_4d8 = *(undefined4 *)(puVar3 + 3);
        uStack_4d4 = *(undefined4 *)((long)puVar3 + 0x1c);
        local_4f0 = &local_4e0;
      }
      else {
        local_4e0 = *plVar2;
        uVar9 = extraout_XMM0_Da_02;
        uVar10 = extraout_XMM0_Db_02;
        local_4f0 = (long *)*puVar3;
      }
      *puVar3 = plVar2;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      log(this,(double)CONCAT44(uVar10,uVar9));
    }
    if (local_4f0 != &local_4e0) {
      operator_delete(local_4f0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
LAB_001866f0:
      operator_delete(local_4d0._M_dataplus._M_p);
    }
  }
  if (*(int *)((long)aiStack_420 + *(long *)(local_440._M_dataplus._M_p + -0x18)) == 0) {
    std::istream::seekg((long)&local_440,_S_beg);
    uVar4 = std::istream::tellg();
    std::istream::seekg((long)&local_440,_S_beg);
    pvVar5 = operator_new__(uVar4);
    std::istream::read((char *)&local_440,(long)pvVar5);
    p_Var6 = (*(this->m_Dispatch).clCreateProgramWithIL)(local_450,pvVar5,uVar4,local_448);
    if (p_Var6 != (cl_program)0x0) {
      logf(this,__x);
    }
    operator_delete__(pvVar5);
    std::ifstream::close();
  }
  else {
    p_Var6 = (cl_program)0x0;
  }
  std::ifstream::~ifstream(&local_440);
  if ((cl_context)local_490._0_8_ != (cl_context)(local_490 + 0x10)) {
    operator_delete((void *)local_490._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p);
  }
LAB_001867fe:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return p_Var6;
}

Assistant:

cl_program CLIntercept::createProgramWithInjectionSPIRV(
    uint64_t hash,
    cl_context context,
    cl_int* errcode_ret )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_program  program = NULL;

    // Don't bother with any of this if we weren't able to get a pointer to
    // the entry point to create a program with IL.
    if( dispatch().clCreateProgramWithIL == NULL )
    {
        log( "Aborting InjectProgramSPIRV because clCreateProgramWithIL is NULL!\n" );
    }
    else
    {
        std::string fileName;

        // Get the dump directory name.
        {
            OS().GetDumpDirectoryNameWithoutPid(sc_DumpDirectoryName, fileName);
            fileName += "/Inject";
        }

        // Make three candidate file names.  They will have the form:
        //   CLI_<program number>_<hash>_0000.spv, or
        //   CLI_<hash>_0000.spv
        {
            char    numberString1[256] = "";
            CLI_SPRINTF(numberString1, 256, "%04u_%08X_0000",
                m_ProgramNumber,
                (unsigned int)hash);

            char    numberString2[256] = "";
            CLI_SPRINTF(numberString2, 256, "%08X_0000",
                (unsigned int)hash);

            std::string fileName1;
            fileName1 = fileName;
            fileName1 += "/CLI_";
            fileName1 += numberString1;
            fileName1 += ".spv";

            std::string fileName2;
            fileName2 = fileName;
            fileName2 += "/CLI_";
            fileName2 += numberString2;
            fileName2 += ".spv";

            std::ifstream is;

            is.open(
                fileName1.c_str(),
                std::ios::in | std::ios::binary);
            if( is.good() )
            {
                log("Injecting SPIR-V file: " + fileName1 + "\n");
            }
            else
            {
                log("Injection SPIR-V file doesn't exist: " + fileName1 + "\n");

                is.clear();
                is.open(
                    fileName2.c_str(),
                    std::ios::in | std::ios::binary);
                if( is.good() )
                {
                    log("Injecting SPIR-V file: " + fileName2 + "\n");
                }
                else
                {
                    log("Injection SPIR-V file doesn't exist: " + fileName2 + "\n");
                }
            }

            if( is.good() )
            {
                // The file exists.  Figure out how big it is.
                size_t  filesize = 0;

                is.seekg( 0, std::ios::end );
                filesize = (size_t)is.tellg();
                is.seekg( 0, std::ios::beg );

                char*   newILBinary = new char[ filesize ];
                if( newILBinary == NULL )
                {
                    CLI_ASSERT( 0 );
                }
                else
                {
                    is.read(newILBinary, filesize);

                    // Right now, this can still die in the ICD loader if the ICD loader
                    // exports this entry point but the vendor didn't implement it.  It
                    // would be nice to enhance the ICD loader so it called into a safe
                    // stub function if the vendor didn't implement an entry point...
                    program = dispatch().clCreateProgramWithIL(
                        context,
                        newILBinary,
                        filesize,
                        errcode_ret );
                    if( program )
                    {
                        logf("Injection successful: clCreateProgramWithIL() returned %p\n",
                            program );
                    }

                    delete[] newILBinary;
                }

                is.close();
            }
        }
    }

    return program;
}